

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isDriveStrength(TokenKind kind)

{
  int iVar1;
  uint uVar2;
  undefined6 in_register_0000003a;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,kind);
  uVar2 = iVar1 - 0x11f;
  if (((0x2d < uVar2) || ((0x300000000033U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) &&
     ((uVar2 = iVar1 - 0xb4, 0x3f < uVar2 ||
      ((0xc000000000000003U >> ((ulong)uVar2 & 0x3f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isDriveStrength(TokenKind kind) {
    switch (kind) {
        case TokenKind::Supply0Keyword:
        case TokenKind::Strong0Keyword:
        case TokenKind::Pull0Keyword:
        case TokenKind::Weak0Keyword:
        case TokenKind::HighZ0Keyword:
        case TokenKind::Supply1Keyword:
        case TokenKind::Strong1Keyword:
        case TokenKind::Pull1Keyword:
        case TokenKind::Weak1Keyword:
        case TokenKind::HighZ1Keyword:
            return true;
        default:
            return false;
    }
}